

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_util.c
# Opt level: O2

void dec_derive_skip_mv_umve(com_core_t *core,int umve_idx)

{
  com_scu_t *pcVar1;
  s16 (*paasVar2) [2] [2];
  s8 (*pasVar3) [2];
  char cVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  undefined2 uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  s8 *psVar13;
  char cVar14;
  s8 asVar15 [2];
  s16 sVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  byte local_76;
  byte bStack_75;
  s16 pmv_base_cands [2] [2];
  uint local_68 [6];
  long local_50;
  int neighbor [5];
  
  iVar5 = umve_idx / 0x14;
  iVar10 = umve_idx % 0x14;
  iVar11 = core->cu_scup;
  iVar8 = core->seqhdr->i_scu;
  pcVar1 = (core->map).map_scu;
  paasVar2 = (core->map).map_mv;
  pasVar3 = (core->map).map_refi;
  if (0 < iVar5) {
    iVar5 = 1;
  }
  neighbor[3] = iVar11 + -1;
  neighbor[0] = ((core->cu_height >> 2) + -1) * iVar8 + iVar11 + -1;
  iVar11 = iVar11 - iVar8;
  neighbor[2] = (core->cu_width >> 2) + iVar11;
  neighbor[1] = neighbor[2] + -1;
  local_50 = (long)iVar11;
  neighbor[4] = iVar11 + -1;
  local_68[0] = (byte)pcVar1[neighbor[0]] >> 2 & 1;
  local_68[1] = (byte)pcVar1[(long)neighbor[2] + -1] >> 2 & 1;
  local_68[2] = (byte)pcVar1[neighbor[2]] >> 2 & 1;
  local_68[3] = (byte)pcVar1[neighbor[3]] >> 2 & 1;
  local_68[4] = (byte)pcVar1[local_50 + -1] >> 2 & 1;
  cVar4 = (char)local_68[1];
  if ((((byte)pcVar1[neighbor[0]] >> 2 & 1) != 0) && (cVar4 != '\0')) {
    asVar15 = pasVar3[(long)neighbor[2] + -1];
    local_68[1] = 1;
    if ((asVar15 == pasVar3[neighbor[0]]) &&
       (((asVar15[0] == -1 || (paasVar2[(long)neighbor[2] + -1][0] == paasVar2[neighbor[0]][0])) &&
        (local_68[1] = 0, (ushort)asVar15 < 0xff00)))) {
      local_68[1] = (uint)(paasVar2[(long)neighbor[2] + -1][1] != paasVar2[neighbor[0]][1]);
    }
  }
  if ((cVar4 != '\0') && ((char)local_68[2] != '\0')) {
    asVar15 = pasVar3[(long)neighbor[2] + -1];
    local_68[2] = 1;
    if (((asVar15 == pasVar3[neighbor[2]]) &&
        ((asVar15[0] == -1 || (paasVar2[(long)neighbor[2] + -1][0] == paasVar2[neighbor[2]][0]))))
       && (local_68[2] = 0, (ushort)asVar15 < 0xff00)) {
      local_68[2] = (uint)(paasVar2[(long)neighbor[2] + -1][1] != paasVar2[neighbor[2]][1]);
    }
  }
  cVar14 = (char)local_68[3];
  if (((char)local_68[0] != '\0') && (cVar14 != '\0')) {
    asVar15 = pasVar3[neighbor[3]];
    local_68[3] = 1;
    if ((asVar15 == pasVar3[neighbor[0]]) &&
       (((asVar15[0] == -1 || (paasVar2[neighbor[3]][0] == paasVar2[neighbor[0]][0])) &&
        (local_68[3] = 0, (ushort)asVar15 < 0xff00)))) {
      local_68[3] = (uint)(paasVar2[neighbor[3]][1] != paasVar2[neighbor[0]][1]);
    }
  }
  if ((char)local_68[4] != '\0') {
    if (cVar14 == '\0') {
      if (cVar4 == '\0') {
        bVar23 = true;
      }
      else {
        asVar15 = pasVar3[local_50 + -1];
LAB_0010979a:
        bVar23 = true;
        if ((asVar15 == pasVar3[(long)neighbor[2] + -1]) &&
           ((asVar15[0] == -1 || (paasVar2[local_50 + -1][0] == paasVar2[(long)neighbor[2] + -1][0])
            ))) {
          if ((ushort)asVar15 >> 8 == 0xff) goto LAB_001097be;
          bVar23 = paasVar2[local_50 + -1][1] != paasVar2[(long)neighbor[2] + -1][1];
        }
      }
    }
    else {
      asVar15 = pasVar3[local_50 + -1];
      if ((asVar15 == pasVar3[neighbor[3]]) &&
         ((asVar15[0] == -1 || (paasVar2[local_50 + -1][0] == paasVar2[neighbor[3]][0])))) {
        if ((ushort)asVar15 >> 8 != 0xff) {
          bVar22 = paasVar2[local_50 + -1][1] == paasVar2[neighbor[3]][1];
          goto LAB_00109770;
        }
LAB_001097be:
        bVar23 = false;
      }
      else {
        bVar22 = false;
LAB_00109770:
        bVar23 = (bool)(bVar22 ^ 1);
        if ((bVar22 == false) && (cVar4 != '\0')) goto LAB_0010979a;
      }
    }
    local_68[4] = (uint)bVar23;
  }
  uVar12 = 0;
  bStack_75 = 0xff;
  local_76 = 0xff;
  iVar11 = 0;
  while ((uVar12 < 5 && (iVar11 <= iVar5))) {
    if (local_68[uVar12] != 0) {
      if (iVar11 == iVar5) {
        iVar8 = neighbor[uVar12];
        if (-1 < pasVar3[iVar8][0]) {
          pmv_base_cands[0] = paasVar2[iVar8][0];
          local_76 = pasVar3[iVar8][0];
        }
        if (-1 < pasVar3[iVar8][1]) {
          pmv_base_cands[1] = paasVar2[iVar8][1];
          bStack_75 = pasVar3[iVar8][1];
        }
      }
      iVar11 = iVar11 + 1;
    }
    uVar12 = uVar12 + 1;
  }
  if (iVar5 < iVar11) {
LAB_0010986a:
    if (iVar11 <= iVar5) {
      pmv_base_cands[0][0] = 0;
      pmv_base_cands[0][1] = 0;
      bStack_75 = 0xff;
      local_76 = 0;
    }
  }
  else {
    if (iVar11 != iVar5) {
      iVar11 = iVar11 + 1;
      goto LAB_0010986a;
    }
    derive_temporal_motions(core,pmv_base_cands,(s8 *)&local_76);
  }
  cVar4 = (char)iVar10 / '\x04';
  iVar11 = cVar4 * 4;
  iVar8 = *(int *)(&DAT_001599d0 + (long)cVar4 * 4);
  core->refi[0] = -1;
  core->refi[1] = -1;
  iVar5 = iVar10 + cVar4 * -4;
  psVar13 = core->refi + 1;
  if (((char)local_76 < '\0') || ((char)bStack_75 < '\0')) {
    if (-1 < (char)local_76) {
      if ((iVar10 == iVar11) || ((iVar11 = 0, iVar5 != 2 && (iVar8 = -iVar8, iVar5 == 1)))) {
        iVar11 = iVar8;
        iVar8 = 0;
      }
      iVar11 = pmv_base_cands[0][0] + iVar11;
      iVar8 = pmv_base_cands[0][1] + iVar8;
      if (0x7ffe < iVar11) {
        iVar11 = 0x7fff;
      }
      sVar16 = -0x8000;
      if (-0x8000 < iVar11) {
        sVar16 = (s16)iVar11;
      }
      psVar13 = core->refi;
      core->mv[0][0] = sVar16;
      lVar7 = 0x26;
      goto LAB_00109aa5;
    }
    if ((char)bStack_75 < '\0') {
      return;
    }
    if ((iVar10 == iVar11) || ((iVar11 = 0, iVar5 != 2 && (iVar8 = -iVar8, iVar5 == 1)))) {
      iVar11 = iVar8;
      iVar8 = 0;
    }
    iVar11 = pmv_base_cands[1][0] + iVar11;
    iVar8 = pmv_base_cands[1][1] + iVar8;
    if (0x7ffe < iVar11) {
      iVar11 = 0x7fff;
    }
    sVar16 = -0x8000;
    if (-0x8000 < iVar11) {
      sVar16 = (s16)iVar11;
    }
    core->mv[1][0] = sVar16;
  }
  else {
    iVar6 = (int)core->refp[local_76][0].dist;
    uVar18 = iVar6 * 2;
    iVar17 = (int)core->refp[bStack_75][1].dist;
    uVar19 = iVar17 * 2;
    uVar21 = iVar17 * -2;
    if ((int)uVar21 < 0) {
      uVar21 = uVar19;
    }
    uVar20 = iVar6 * -2;
    if ((int)uVar20 < 0) {
      uVar20 = uVar18;
    }
    uVar18 = (int)(uVar19 * uVar18) >> 0x1f | 1;
    if (uVar21 < uVar20) {
      iVar17 = 0x4000;
      iVar6 = (int)(0x4000 / (ulong)uVar20) * uVar21;
      uVar21 = 1;
      uVar19 = uVar18;
    }
    else {
      iVar6 = 0x4000;
      iVar17 = (int)(0x4000 / (ulong)uVar21) * uVar20;
      uVar19 = 1;
      uVar21 = uVar18;
    }
    iVar17 = (iVar17 * iVar8 + 0x2000 >> 0xe) * uVar21;
    if (0x7ffe < iVar17) {
      iVar17 = 0x7fff;
    }
    if (iVar17 < -0x7fff) {
      iVar17 = -0x8000;
    }
    iVar6 = (iVar6 * iVar8 + 0x2000 >> 0xe) * uVar19;
    if (0x7ffe < iVar6) {
      iVar6 = 0x7fff;
    }
    if (iVar6 < -0x7fff) {
      iVar6 = -0x8000;
    }
    if (iVar10 == iVar11) {
LAB_001099cd:
      iVar11 = iVar17;
      iVar17 = 0;
      iVar8 = 0;
    }
    else {
      iVar11 = 0;
      iVar8 = iVar6;
      if (iVar5 != 2) {
        iVar17 = -iVar17;
        iVar6 = -iVar6;
        iVar8 = iVar6;
        if (iVar5 == 1) goto LAB_001099cd;
      }
      iVar6 = 0;
    }
    iVar11 = pmv_base_cands[0][0] + iVar11;
    iVar17 = pmv_base_cands[0][1] + iVar17;
    if (0x7ffe < iVar11) {
      iVar11 = 0x7fff;
    }
    sVar16 = (s16)iVar11;
    if (iVar11 < -0x7fff) {
      sVar16 = -0x8000;
    }
    core->mv[0][0] = sVar16;
    if (0x7ffe < iVar17) {
      iVar17 = 0x7fff;
    }
    sVar16 = (s16)iVar17;
    if (iVar17 < -0x7fff) {
      sVar16 = -0x8000;
    }
    core->mv[0][1] = sVar16;
    core->refi[0] = local_76;
    iVar6 = pmv_base_cands[1][0] + iVar6;
    iVar8 = pmv_base_cands[1][1] + iVar8;
    if (0x7ffe < iVar6) {
      iVar6 = 0x7fff;
    }
    sVar16 = (s16)iVar6;
    if (iVar6 < -0x7fff) {
      sVar16 = -0x8000;
    }
    core->mv[1][0] = sVar16;
  }
  lVar7 = 0x2a;
  local_76 = bStack_75;
LAB_00109aa5:
  iVar11 = 0x7fff;
  if (iVar8 < 0x7fff) {
    iVar11 = iVar8;
  }
  uVar9 = 0x8000;
  if (-0x8000 < iVar11) {
    uVar9 = (undefined2)iVar11;
  }
  *(undefined2 *)(core->cbfy + lVar7 + -0x14) = uVar9;
  *psVar13 = local_76;
  return;
}

Assistant:

void dec_derive_skip_mv_umve(com_core_t * core, int umve_idx)
{
    s16 pmv_base_cands[REFP_NUM][MV_D];
    s8  refi_base_cands[REFP_NUM];
    int base_idx = umve_idx / UMVE_MAX_REFINE_NUM;

    if (derive_umve_base_motions(core, base_idx, pmv_base_cands, refi_base_cands)) {
        derive_temporal_motions(core, pmv_base_cands, refi_base_cands);
    } 
    derive_umve_final_motions(core, umve_idx, pmv_base_cands, refi_base_cands);
}